

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O0

bool __thiscall
cmOptionCommand::InitialPass
          (cmOptionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  CacheEntryType CVar3;
  size_type sVar4;
  char *pcVar5;
  cmState *this_00;
  const_reference pvVar6;
  const_reference value;
  char *doc;
  bool init;
  string local_108;
  char *local_e8;
  char *existingValue;
  cmState *state;
  string local_d0 [8];
  string initialValue;
  allocator local_89;
  undefined1 local_88 [8];
  string m;
  allocator local_51;
  string local_50;
  byte local_29;
  cmExecutionStatus *pcStack_28;
  bool argError;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmOptionCommand *this_local;
  
  local_29 = 0;
  pcStack_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    local_29 = 1;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_51);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((pcVar5 != (char *)0x0) &&
     (sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local), 3 < sVar4)) {
    local_29 = 1;
  }
  if ((local_29 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_88,"called with incorrect number of arguments: ",&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)((long)&initialValue.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local," ");
    std::__cxx11::string::operator+=
              ((string *)local_88,(string *)(initialValue.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(initialValue.field_2._M_local_buf + 8));
    cmCommand::SetError(&this->super_cmCommand,(string *)local_88);
    this_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_88);
    goto LAB_0061917b;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"Off",(allocator *)((long)&state + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&state + 7));
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  existingValue = (char *)this_00;
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  local_e8 = cmState::GetCacheEntryValue(this_00,pvVar6);
  pcVar5 = existingValue;
  if (local_e8 == (char *)0x0) {
LAB_00619069:
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar4 == 3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,2);
      std::__cxx11::string::operator=(local_d0,(string *)pvVar6);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmSystemTools::IsOn(pcVar5);
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    pcVar5 = "OFF";
    if (bVar2) {
      pcVar5 = "ON";
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local,1);
    doc = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition(pcVar1,pvVar6,pcVar5,doc,BOOL,false);
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    CVar3 = cmState::GetCacheEntryType((cmState *)pcVar5,pvVar6);
    pcVar5 = existingValue;
    if (CVar3 == UNINITIALIZED) {
      std::__cxx11::string::operator=(local_d0,local_e8);
      goto LAB_00619069;
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"HELPSTRING",(allocator *)&init);
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,1);
    cmState::SetCacheEntryProperty((cmState *)pcVar5,pvVar6,&local_108,value);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&init);
  }
  this_local._7_1_ = 1;
  std::__cxx11::string::~string(local_d0);
LAB_0061917b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOptionCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  bool argError = false;
  if(args.size() < 2)
    {
    argError = true;
    }
  // for VTK 4.0 we have to support the option command with more than 3
  // arguments if CMAKE_MINIMUM_REQUIRED_VERSION is not defined, if
  // CMAKE_MINIMUM_REQUIRED_VERSION is defined, then we can have stricter
  // checking.
  if(this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION"))
    {
    if(args.size() > 3)
      {
      argError = true;
      }
    }
  if(argError)
    {
    std::string m = "called with incorrect number of arguments: ";
    m += cmJoin(args, " ");
    this->SetError(m);
    return false;
    }

  std::string initialValue = "Off";
  // Now check and see if the value has been stored in the cache
  // already, if so use that value and don't look for the program
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(args[0]);
  if(existingValue)
    {
    if (state->GetCacheEntryType(args[0]) != cmState::UNINITIALIZED)
      {
      state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
      return true;
      }
    initialValue = existingValue;
    }
  if(args.size() == 3)
    {
    initialValue = args[2];
    }
  bool init = cmSystemTools::IsOn(initialValue.c_str());
  this->Makefile->AddCacheDefinition(args[0], init? "ON":"OFF",
                                     args[1].c_str(), cmState::BOOL);
  return true;
}